

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

Operand * __thiscall IrSim::newTmpVar(Operand *__return_storage_ptr__,IrSim *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  size_type sVar3;
  uint __val;
  uint uVar4;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  ulong *puVar8;
  uint __len;
  string __str;
  ulong *local_70;
  ulong local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar2 = this->tmpSeq;
  this->tmpSeq = uVar2 + 1;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0010fb62;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0010fb62;
      }
      if (uVar6 < 10000) goto LAB_0010fb62;
      uVar7 = uVar7 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0010fb62:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar2 >> 0x1f),__len,__val);
  plVar5 = (long *)std::__cxx11::string::replace
                             ((ulong)local_50,0,(char *)0x0,
                              (ulong)(this->tmpVarPrefix)._M_dataplus._M_p);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_60 = *puVar8;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar8;
    local_70 = (ulong *)*plVar5;
  }
  sVar3 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __return_storage_ptr__->kind = 1;
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_70 == &local_60) {
    paVar1->_M_allocated_capacity = local_60;
    *(long *)((long)&(__return_storage_ptr__->value).field_2 + 8) = lStack_58;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_70;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity = local_60;
  }
  (__return_storage_ptr__->value)._M_string_length = sVar3;
  local_60 = local_60 & 0xffffffffffffff00;
  __return_storage_ptr__->active = -1;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Operand newTmpVar() { return Operand(OP_VARIABLE, tmpVarPrefix + to_string(tmpSeq++)); }